

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O0

void __thiscall
pass_remove_empty_switch_all_Test::~pass_remove_empty_switch_all_Test
          (pass_remove_empty_switch_all_Test *this)

{
  pass_remove_empty_switch_all_Test *this_local;
  
  ~pass_remove_empty_switch_all_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(pass, remove_empty_switch_all) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &out = mod.var("out", 1);
    auto seq = mod.sequential();
    auto case_ = std::make_shared<SwitchStmt>(out.shared_from_this());
    seq->add_stmt(case_);
    remove_empty_block(&mod);
    EXPECT_EQ(mod.stmts_count(), 0);
}